

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateBufferBackedVariableAggregateTypeCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramInterface interface,ProgramResourcePropFlags targetProp,DataType dataType,
               string *nameSuffix,int depth)

{
  Node *pNVar1;
  SharedPtrStateBase *pSVar2;
  ResourceTestCase *this;
  deInt32 *pdVar3;
  SharedPtr variable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ProgramResourceQueryTestTarget local_38;
  
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar1->m_type = TYPE_VARIABLE;
  (pNVar1->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar2 = parentStructure->m_state;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar3 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar3 = *pdVar3 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
  *(DataType *)&pNVar1[1]._vptr_Node = dataType;
  variable.m_state = (SharedPtrStateBase *)0x0;
  variable.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  variable.m_state = pSVar2;
  this = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget(&local_38,interface,targetProp);
  std::operator+(&local_58,"var",nameSuffix);
  ResourceTestCase::ResourceTestCase(this,context,&variable,&local_38,local_58._M_dataplus._M_p);
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)this);
  pdVar3 = &pSVar2->strongRefCount;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  LOCK();
  *pdVar3 = *pdVar3 + -1;
  UNLOCK();
  if (*pdVar3 == 0) {
    variable.m_ptr = (Node *)0x0;
    (*(variable.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar3 = &(variable.m_state)->weakRefCount;
  *pdVar3 = *pdVar3 + -1;
  UNLOCK();
  if (*pdVar3 == 0) {
    if (variable.m_state != (SharedPtrStateBase *)0x0) {
      (*(variable.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    variable.m_state = (SharedPtrStateBase *)0x0;
  }
  if (0 < depth) {
    pNVar1 = (Node *)operator_new(0x20);
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar1->m_type = TYPE_STRUCT_MEMBER;
    (pNVar1->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar2 = parentStructure->m_state;
    (pNVar1->m_enclosingNode).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar3 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar3 = *pdVar3 + 1;
      UNLOCK();
    }
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52978;
    variable.m_state = (SharedPtrStateBase *)0x0;
    variable.m_ptr = pNVar1;
    pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar2->strongRefCount = 0;
    pSVar2->weakRefCount = 0;
    pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar2->strongRefCount = 1;
    pSVar2->weakRefCount = 1;
    variable.m_state = pSVar2;
    std::operator+(&local_58,"_struct",nameSuffix);
    generateBufferBackedVariableAggregateTypeCases
              (context,&variable,targetGroup,interface,targetProp,dataType,&local_58,depth + -1);
    pdVar3 = &pSVar2->strongRefCount;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    LOCK();
    *pdVar3 = *pdVar3 + -1;
    UNLOCK();
    if (*pdVar3 == 0) {
      variable.m_ptr = (Node *)0x0;
      (*(variable.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar3 = &(variable.m_state)->weakRefCount;
    *pdVar3 = *pdVar3 + -1;
    UNLOCK();
    if (*pdVar3 == 0) {
      if (variable.m_state != (SharedPtrStateBase *)0x0) {
        (*(variable.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      variable.m_state = (SharedPtrStateBase *)0x0;
    }
    pNVar1 = (Node *)operator_new(0x28);
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
    pNVar1->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar1->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar2 = parentStructure->m_state;
    (pNVar1->m_enclosingNode).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar3 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar3 = *pdVar3 + 1;
      UNLOCK();
    }
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b528b8;
    *(undefined4 *)&pNVar1[1]._vptr_Node = 0xffffffff;
    variable.m_state = (SharedPtrStateBase *)0x0;
    variable.m_ptr = pNVar1;
    pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar2->strongRefCount = 0;
    pSVar2->weakRefCount = 0;
    pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
    pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar2->strongRefCount = 1;
    pSVar2->weakRefCount = 1;
    variable.m_state = pSVar2;
    std::operator+(&local_58,"_array",nameSuffix);
    generateBufferBackedVariableAggregateTypeCases
              (context,&variable,targetGroup,interface,targetProp,dataType,&local_58,depth + -1);
    pdVar3 = &pSVar2->strongRefCount;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    LOCK();
    *pdVar3 = *pdVar3 + -1;
    UNLOCK();
    if (*pdVar3 == 0) {
      variable.m_ptr = (Node *)0x0;
      (*(variable.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar3 = &(variable.m_state)->weakRefCount;
    *pdVar3 = *pdVar3 + -1;
    UNLOCK();
    if ((*pdVar3 == 0) && (variable.m_state != (SharedPtrStateBase *)0x0)) {
      (*(variable.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateBufferBackedVariableAggregateTypeCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, ProgramInterface interface, ProgramResourcePropFlags targetProp, glu::DataType dataType, const std::string& nameSuffix, int depth)
{
	// variable
	{
		const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, dataType));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(interface, targetProp), ("var" + nameSuffix).c_str()));
	}

	// struct
	if (depth > 0)
	{
		const ResourceDefinition::Node::SharedPtr structMember(new ResourceDefinition::StructMember(parentStructure));
		generateBufferBackedVariableAggregateTypeCases(context, structMember, targetGroup, interface, targetProp, dataType, "_struct" + nameSuffix, depth - 1);
	}

	// array
	if (depth > 0)
	{
		const ResourceDefinition::Node::SharedPtr arrayElement(new ResourceDefinition::ArrayElement(parentStructure));
		generateBufferBackedVariableAggregateTypeCases(context, arrayElement, targetGroup, interface, targetProp, dataType, "_array" + nameSuffix, depth - 1);
	}
}